

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O1

TRef lj_opt_narrow_convert(jit_State *J)

{
  NarrowIns *pNVar1;
  IRRef1 IVar2;
  IROpT IVar3;
  IRRef IVar4;
  NarrowIns *pNVar5;
  TRef TVar6;
  uint uVar7;
  IRType IVar8;
  TRef TVar9;
  short sVar10;
  IRRef1 IVar11;
  IRRef IVar12;
  NarrowIns *pNVar13;
  IRType *pIVar14;
  IRType *pIVar15;
  NarrowConv local_450;
  
  if ((J->flags & 0x200000) != 0) {
    pNVar13 = local_450.stack;
    local_450.maxsp = local_450.stack + 0xfc;
    local_450.t = (J->fold).ins.field_1.t.irt & IRT_TYPE;
    local_450.mode = 0;
    if ((J->fold).ins.field_1.o != '\\') {
      local_450.mode = (IRRef)(J->fold).ins.field_0.op2;
    }
    local_450.J = J;
    local_450.sp = pNVar13;
    TVar6 = narrow_conv_backprop(&local_450,(uint)(J->fold).ins.field_0.op1,0);
    pNVar5 = local_450.sp;
    TVar9 = TVar6;
    if (((int)TVar6 < 2) && (TVar9 = local_450.stack[0], pNVar13 < local_450.sp)) {
      IVar2 = (J->fold).ins.field_0.op2;
      IVar3 = (J->fold).ins.field_0.ot;
      sVar10 = 0xc80;
      pIVar14 = pNVar13;
      if (-1 < (char)(J->fold).ins.field_1.t.irt) {
        sVar10 = 0;
      }
      do {
        pNVar1 = pNVar13 + 1;
        IVar8 = *pNVar13;
        if (IVar8 < 0x10000) {
          *pIVar14 = IVar8;
LAB_0015aa6d:
          pNVar13 = pNVar1;
          pIVar15 = pIVar14 + 1;
        }
        else {
          uVar7 = IVar8 >> 0x10;
          if (uVar7 == 3) {
            if (local_450.t == IRT_I64) {
              IVar8 = lj_ir_kint64(J,(long)(int)*pNVar1);
            }
            else {
              IVar8 = lj_ir_kint(J,*pNVar1);
            }
            *pIVar14 = IVar8;
            pIVar15 = pIVar14 + 1;
            pNVar13 = pNVar13 + 2;
          }
          else if (uVar7 == 2) {
            (J->fold).ins.field_0.op1 = (short)pIVar14[-1];
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b150ab3;
            IVar8 = lj_opt_fold(J);
            pIVar14[-1] = IVar8;
            pNVar13 = pNVar1;
            pIVar15 = pIVar14;
          }
          else {
            IVar11 = (IRRef1)IVar8;
            if (uVar7 == 1) {
              (J->fold).ins.field_0.ot = IVar3;
              (J->fold).ins.field_0.op1 = IVar11;
              (J->fold).ins.field_0.op2 = IVar2;
              IVar8 = lj_ir_emit(J);
              *pIVar14 = IVar8;
              goto LAB_0015aa6d;
            }
            pIVar15 = pIVar14 + -1;
            IVar12 = local_450.mode;
            if ((local_450.mode & 0xf000) == 0x2000) {
              if (((pNVar1 == pNVar5) && (-1 < (short)*pIVar15)) &&
                 (-1 < (int)((J->cur).ir[*pIVar15 & 0x7fff].field_1.op12 + 0x40000000))) {
                sVar10 = 0;
              }
              else {
                IVar12 = local_450.mode | 0x1000;
              }
            }
            uVar7 = pIVar14[-2];
            IVar4 = pIVar14[-1];
            (J->fold).ins.field_0.ot = (short)(IVar8 >> 0x10) + sVar10;
            (J->fold).ins.field_0.op1 = (IRRef1)uVar7;
            (J->fold).ins.field_0.op2 = (IRRef1)IVar4;
            TVar9 = lj_opt_fold(J);
            pIVar14[-2] = TVar9;
            pNVar13 = pNVar1;
            if (IVar11 != 0) {
              uVar7 = J->bpropslot;
              J->bpropslot = uVar7 + 1 & 0xf;
              J->bpropcache[uVar7].key = IVar11;
              J->bpropcache[uVar7].val = (IRRef1)TVar9;
              J->bpropcache[uVar7].mode = IVar12;
            }
          }
        }
        pIVar14 = pIVar15;
        TVar9 = local_450.stack[0];
      } while (pNVar13 < pNVar5);
    }
    if ((int)TVar6 < 2) {
      return TVar9;
    }
  }
  return 0;
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_convert(jit_State *J)
{
  if ((J->flags & JIT_F_OPT_NARROW)) {
    NarrowConv nc;
    nc.J = J;
    nc.sp = nc.stack;
    nc.maxsp = &nc.stack[NARROW_MAX_STACK-4];
    nc.t = irt_type(fins->t);
    if (fins->o == IR_TOBIT) {
      nc.mode = IRCONV_TOBIT;  /* Used only in the backpropagation cache. */
    } else {
      nc.mode = fins->op2;
    }
    if (narrow_conv_backprop(&nc, fins->op1, 0) <= 1)
      return narrow_conv_emit(J, &nc);
  }
  return NEXTFOLD;
}